

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void __thiscall gvr::PLYWriter::writeListSize(PLYWriter *this,int v)

{
  PLYValue *pPVar1;
  
  if (this->header_complete == false) {
    writeHeader(this);
  }
  pPVar1 = nextValue(this);
  (*pPVar1->_vptr_PLYValue[8])(pPVar1,&this->field_0x50,v);
  this->plist = v;
  return;
}

Assistant:

void PLYWriter::writeListSize(int v)
{
  if (!header_complete)
  {
    writeHeader();
  }

  nextValue().writeListSize(out.rdbuf(), v);

  plist=v;
}